

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXTokenizer.cpp
# Opt level: O1

void Assimp::FBX::Tokenize(TokenList *output_tokens,char *input)

{
  byte bVar1;
  bool bVar2;
  uint column;
  uint line;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  char *token_begin;
  char *token_end;
  byte *local_68;
  vector<Assimp::FBX::Token_const*,std::allocator<Assimp::FBX::Token_const*>> *local_60;
  byte *local_58;
  string local_50;
  
  local_68 = (byte *)0x0;
  local_58 = (byte *)0x0;
  column = 1;
  bVar4 = false;
  bVar5 = false;
  bVar3 = false;
  line = 1;
  local_60 = (vector<Assimp::FBX::Token_const*,std::allocator<Assimp::FBX::Token_const*>> *)
             output_tokens;
  do {
    bVar1 = *input;
    bVar2 = true;
    if ((1 < bVar1 - 0xc) && (bVar1 != 10)) {
      if (bVar1 == 0) {
        return;
      }
      bVar2 = false;
    }
    if (bVar2) {
      bVar4 = false;
      column = 0;
    }
    line = line + bVar2;
    if (!bVar4) {
      if (bVar5) {
        if (bVar1 == 0x22) {
          local_58 = (byte *)input;
          anon_unknown_3::ProcessDataToken
                    ((TokenList *)local_60,(char **)&local_68,(char **)&local_58,line,column,
                     TokenType_DATA,false);
          bVar5 = false;
LAB_0056507b:
          bVar3 = false;
        }
      }
      else if (bVar1 < 0x22) {
        if (bVar1 < 0xc) {
          if ((bVar1 - 9 < 2) || (bVar1 == 0)) {
LAB_0056504d:
            if (local_68 != (byte *)0x0) {
              anon_unknown_3::ProcessDataToken
                        ((TokenList *)local_60,(char **)&local_68,(char **)&local_58,line,column,
                         TokenType_DATA,false);
            }
            goto LAB_0056507b;
          }
        }
        else if ((bVar1 - 0xc < 2) || (bVar1 == 0x20)) goto LAB_0056504d;
LAB_005651ea:
        if (local_68 == (byte *)0x0) {
          local_68 = (byte *)input;
        }
        bVar3 = true;
        local_58 = (byte *)input;
      }
      else if (bVar1 < 0x3b) {
        if (bVar1 == 0x22) {
          if (local_68 != (byte *)0x0) {
            local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_50,"unexpected double-quote","");
            anon_unknown_3::TokenizeError(&local_50,line,column);
          }
          bVar5 = true;
          local_68 = (byte *)input;
        }
        else {
          if (bVar1 == 0x2c) {
            if (bVar3) {
              anon_unknown_3::ProcessDataToken
                        ((TokenList *)local_60,(char **)&local_68,(char **)&local_58,line,column,
                         TokenType_DATA,true);
            }
            local_50._M_dataplus._M_p = (pointer)operator_new(0x28);
            *(char **)local_50._M_dataplus._M_p = input;
            *(byte **)(local_50._M_dataplus._M_p + 8) = (byte *)input + 1;
            local_50._M_dataplus._M_p[0x10] = '\x04';
            local_50._M_dataplus._M_p[0x11] = '\0';
            local_50._M_dataplus._M_p[0x12] = '\0';
            local_50._M_dataplus._M_p[0x13] = '\0';
            goto LAB_005651b1;
          }
          if (bVar1 != 0x3a) goto LAB_005651ea;
          if (!bVar3) {
            local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_50,"unexpected colon","");
            anon_unknown_3::TokenizeError(&local_50,line,column);
          }
          anon_unknown_3::ProcessDataToken
                    ((TokenList *)local_60,(char **)&local_68,(char **)&local_58,line,column,
                     TokenType_KEY,true);
        }
      }
      else if (bVar1 == 0x3b) {
        anon_unknown_3::ProcessDataToken
                  ((TokenList *)local_60,(char **)&local_68,(char **)&local_58,line,column,
                   TokenType_DATA,false);
        bVar4 = true;
      }
      else {
        if (bVar1 == 0x7b) {
          anon_unknown_3::ProcessDataToken
                    ((TokenList *)local_60,(char **)&local_68,(char **)&local_58,line,column,
                     TokenType_DATA,false);
          local_50._M_dataplus._M_p = (pointer)operator_new(0x28);
          *(char **)local_50._M_dataplus._M_p = input;
          *(byte **)(local_50._M_dataplus._M_p + 8) = (byte *)input + 1;
          local_50._M_dataplus._M_p[0x10] = '\0';
          local_50._M_dataplus._M_p[0x11] = '\0';
          local_50._M_dataplus._M_p[0x12] = '\0';
          local_50._M_dataplus._M_p[0x13] = '\0';
        }
        else {
          if (bVar1 != 0x7d) goto LAB_005651ea;
          anon_unknown_3::ProcessDataToken
                    ((TokenList *)local_60,(char **)&local_68,(char **)&local_58,line,column,
                     TokenType_DATA,false);
          local_50._M_dataplus._M_p = (pointer)operator_new(0x28);
          *(char **)local_50._M_dataplus._M_p = input;
          *(byte **)(local_50._M_dataplus._M_p + 8) = (byte *)input + 1;
          local_50._M_dataplus._M_p[0x10] = '\x01';
          local_50._M_dataplus._M_p[0x11] = '\0';
          local_50._M_dataplus._M_p[0x12] = '\0';
          local_50._M_dataplus._M_p[0x13] = '\0';
        }
LAB_005651b1:
        *(ulong *)(local_50._M_dataplus._M_p + 0x18) = (ulong)line;
        *(uint *)(local_50._M_dataplus._M_p + 0x20) = column;
        std::vector<Assimp::FBX::Token_const*,std::allocator<Assimp::FBX::Token_const*>>::
        emplace_back<Assimp::FBX::Token_const*>(local_60,(Token **)&local_50);
      }
    }
    column = column + (uint)(*input == 9) * 3 + 1;
    input = (char *)((byte *)input + 1);
  } while( true );
}

Assistant:

void Tokenize(TokenList& output_tokens, const char* input)
{
    ai_assert(input);

    // line and column numbers numbers are one-based
    unsigned int line = 1;
    unsigned int column = 1;

    bool comment = false;
    bool in_double_quotes = false;
    bool pending_data_token = false;

    const char* token_begin = NULL, *token_end = NULL;
    for (const char* cur = input;*cur;column += (*cur == '\t' ? ASSIMP_FBX_TAB_WIDTH : 1), ++cur) {
        const char c = *cur;

        if (IsLineEnd(c)) {
            comment = false;

            column = 0;
            ++line;
        }

        if(comment) {
            continue;
        }

        if(in_double_quotes) {
            if (c == '\"') {
                in_double_quotes = false;
                token_end = cur;

                ProcessDataToken(output_tokens,token_begin,token_end,line,column);
                pending_data_token = false;
            }
            continue;
        }

        switch(c)
        {
        case '\"':
            if (token_begin) {
                TokenizeError("unexpected double-quote", line, column);
            }
            token_begin = cur;
            in_double_quotes = true;
            continue;

        case ';':
            ProcessDataToken(output_tokens,token_begin,token_end,line,column);
            comment = true;
            continue;

        case '{':
            ProcessDataToken(output_tokens,token_begin,token_end, line, column);
            output_tokens.push_back(new_Token(cur,cur+1,TokenType_OPEN_BRACKET,line,column));
            continue;

        case '}':
            ProcessDataToken(output_tokens,token_begin,token_end,line,column);
            output_tokens.push_back(new_Token(cur,cur+1,TokenType_CLOSE_BRACKET,line,column));
            continue;

        case ',':
            if (pending_data_token) {
                ProcessDataToken(output_tokens,token_begin,token_end,line,column,TokenType_DATA,true);
            }
            output_tokens.push_back(new_Token(cur,cur+1,TokenType_COMMA,line,column));
            continue;

        case ':':
            if (pending_data_token) {
                ProcessDataToken(output_tokens,token_begin,token_end,line,column,TokenType_KEY,true);
            }
            else {
                TokenizeError("unexpected colon", line, column);
            }
            continue;
        }

        if (IsSpaceOrNewLine(c)) {

            if (token_begin) {
                // peek ahead and check if the next token is a colon in which
                // case this counts as KEY token.
                TokenType type = TokenType_DATA;
                for (const char* peek = cur;  *peek && IsSpaceOrNewLine(*peek); ++peek) {
                    if (*peek == ':') {
                        type = TokenType_KEY;
                        cur = peek;
                        break;
                    }
                }

                ProcessDataToken(output_tokens,token_begin,token_end,line,column,type);
            }

            pending_data_token = false;
        }
        else {
            token_end = cur;
            if (!token_begin) {
                token_begin = cur;
            }

            pending_data_token = true;
        }
    }
}